

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

int lest::run<lest::test[1]>(test (*specification) [1],ostream *os)

{
  int iVar1;
  tests local_30;
  ostream *local_18;
  ostream *os_local;
  test (*specification_local) [1];
  
  local_18 = os;
  os_local = (ostream *)specification;
  make_tests<lest::test[1]>(&local_30,specification);
  iVar1 = run(&local_30,local_18);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_30);
  return iVar1;
}

Assistant:

int run(  C const & specification, std::ostream & os = std::cout )
{
    return run( make_tests( specification ), os  );
}